

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void reportOptions(FILE *file,HighsLogOptions *log_options,
                  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                  bool report_only_deviations,HighsFileType file_type)

{
  HighsOptionType HVar1;
  size_type sVar2;
  const_reference ppOVar3;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  HighsOptionType type;
  HighsInt index;
  HighsInt num_options;
  HighsFileType in_stack_00000098;
  bool in_stack_0000009f;
  OptionRecordDouble *in_stack_000000a0;
  HighsLogOptions *in_stack_000000a8;
  FILE *in_stack_000000b0;
  HighsFileType in_stack_000000b8;
  bool in_stack_000000bf;
  OptionRecordString *in_stack_000000c0;
  HighsLogOptions *in_stack_000000c8;
  FILE *in_stack_000000d0;
  HighsFileType in_stack_00000148;
  bool in_stack_0000014f;
  OptionRecordBool *in_stack_00000150;
  HighsLogOptions *in_stack_00000158;
  FILE *in_stack_00000160;
  int local_28;
  
  sVar2 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::size(in_RDX);
  for (local_28 = 0; local_28 < (int)sVar2; local_28 = local_28 + 1) {
    ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)local_28);
    HVar1 = (*ppOVar3)->type;
    ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)local_28);
    if (((*ppOVar3)->advanced & 1U) == 0) {
      if (HVar1 == kBool) {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (in_RDX,(long)local_28);
        reportOption(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_0000014f,
                     in_stack_00000148);
      }
      else if (HVar1 == kInt) {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (in_RDX,(long)local_28);
        reportOption(in_stack_000000b0,in_stack_000000a8,(OptionRecordInt *)in_stack_000000a0,
                     in_stack_0000009f,in_stack_00000098);
      }
      else if (HVar1 == kDouble) {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (in_RDX,(long)local_28);
        reportOption(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009f,
                     in_stack_00000098);
      }
      else {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (in_RDX,(long)local_28);
        reportOption(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,
                     in_stack_000000b8);
      }
    }
  }
  return;
}

Assistant:

void reportOptions(FILE* file, const HighsLogOptions& log_options,
                   const std::vector<OptionRecord*>& option_records,
                   const bool report_only_deviations,
                   const HighsFileType file_type) {
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = option_records[index]->type;
    // Only report non-advanced options
    if (option_records[index]->advanced) {
      // Possibly skip the advanced options when creating Md file
      if (!kAdvancedInDocumentation) continue;
    }
    if (type == HighsOptionType::kBool) {
      reportOption(file, log_options,
                   ((OptionRecordBool*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else if (type == HighsOptionType::kInt) {
      reportOption(file, log_options,
                   ((OptionRecordInt*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else if (type == HighsOptionType::kDouble) {
      reportOption(file, log_options,
                   ((OptionRecordDouble*)option_records[index])[0],
                   report_only_deviations, file_type);
    } else {
      reportOption(file, log_options,
                   ((OptionRecordString*)option_records[index])[0],
                   report_only_deviations, file_type);
    }
  }
}